

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O1

void ym2612_generate(void *chip,FMSAMPLE *buffer,int frames,int mix)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  FMSAMPLE bufTmp [2];
  short local_2c;
  short local_2a;
  
  ym2612_pre_generate(chip);
  if (frames == 0) {
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x4758);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x4744))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x473c), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4734) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4759);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x472c) + *(int *)((long)chip + lVar4 + 0x471c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x473c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4744) = 0;
              *(byte *)((long)chip + lVar4 + 0x473c) =
                   *(int *)((long)chip + lVar4 + 0x4748) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4759) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x4759) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4744) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x4744);
        if (*(byte *)((long)chip + lVar4 + 0x4759) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x4740);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x4740);
        }
        *(int *)((long)chip + lVar4 + 0x474c) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x48f8);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x48e4))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x48dc), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x48d4) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x48f9);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x48cc) + *(int *)((long)chip + lVar4 + 0x48bc)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x48dc) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x48e4) = 0;
              *(byte *)((long)chip + lVar4 + 0x48dc) =
                   *(int *)((long)chip + lVar4 + 0x48e8) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x48f9) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x48f9) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x48e4) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x48e4);
        if (*(byte *)((long)chip + lVar4 + 0x48f9) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x48e0);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x48e0);
        }
        *(int *)((long)chip + lVar4 + 0x48ec) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x4a98);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x4a84))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x4a7c), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4a74) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4a99);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4a6c) + *(int *)((long)chip + lVar4 + 0x4a5c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4a7c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4a84) = 0;
              *(byte *)((long)chip + lVar4 + 0x4a7c) =
                   *(int *)((long)chip + lVar4 + 0x4a88) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4a99) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x4a99) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4a84) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x4a84);
        if (*(byte *)((long)chip + lVar4 + 0x4a99) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x4a80);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x4a80);
        }
        *(int *)((long)chip + lVar4 + 0x4a8c) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x4c38);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x4c24))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x4c1c), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4c14) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4c39);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4c0c) + *(int *)((long)chip + lVar4 + 0x4bfc)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4c1c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4c24) = 0;
              *(byte *)((long)chip + lVar4 + 0x4c1c) =
                   *(int *)((long)chip + lVar4 + 0x4c28) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4c39) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x4c39) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4c24) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x4c24);
        if (*(byte *)((long)chip + lVar4 + 0x4c39) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x4c20);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x4c20);
        }
        *(int *)((long)chip + lVar4 + 0x4c2c) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x4dd8);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x4dc4))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x4dbc), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4db4) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4dd9);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4dac) + *(int *)((long)chip + lVar4 + 0x4d9c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4dbc) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4dc4) = 0;
              *(byte *)((long)chip + lVar4 + 0x4dbc) =
                   *(int *)((long)chip + lVar4 + 0x4dc8) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4dd9) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x4dd9) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4dc4) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x4dc4);
        if (*(byte *)((long)chip + lVar4 + 0x4dd9) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x4dc0);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x4dc0);
        }
        *(int *)((long)chip + lVar4 + 0x4dcc) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar2 = *(byte *)((long)chip + lVar4 + 0x4f78);
      if ((((bVar2 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar4 + 0x4f64))) &&
         (bVar3 = *(byte *)((long)chip + lVar4 + 0x4f5c), 1 < bVar3)) {
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4f54) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4f79);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar3 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4f4c) + *(int *)((long)chip + lVar4 + 0x4f3c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4f5c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4f64) = 0;
              *(byte *)((long)chip + lVar4 + 0x4f5c) =
                   *(int *)((long)chip + lVar4 + 0x4f68) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar2 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4f79) = 4;
          }
          if ((bVar3 != 4) && (*(byte *)((long)chip + lVar4 + 0x4f79) == (bVar2 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4f64) = 0x3ff;
          }
        }
        iVar5 = *(int *)((long)chip + lVar4 + 0x4f64);
        if (*(byte *)((long)chip + lVar4 + 0x4f79) == (bVar2 & 4)) {
          iVar5 = iVar5 + *(int *)((long)chip + lVar4 + 0x4f60);
        }
        else {
          iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)chip + lVar4 + 0x4f60);
        }
        *(int *)((long)chip + lVar4 + 0x4f6c) = iVar5;
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
  }
  if (0 < frames) {
    do {
      if (mix == 0) {
        ym2612_generate_one_native(chip,buffer);
      }
      else {
        ym2612_generate_one_native(chip,&local_2c);
        *buffer = *buffer + local_2c;
        buffer[1] = buffer[1] + local_2a;
      }
      buffer = buffer + 2;
      frames = frames + -1;
    } while (frames != 0);
  }
  return;
}

Assistant:

void ym2612_generate(void *chip, FMSAMPLE *buffer, int frames, int mix)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_CH  *cch = F2612->CH;
	FMSAMPLE  *bufOut = buffer;
	int i;
#if !RSM_ENABLE
	FMSAMPLE bufTmp[2];
#endif

	ym2612_pre_generate(chip);

	if (!frames)
	{
		update_ssg_eg_channel(&cch[0].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5].SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0 ; i < frames ; i++)
	{
#if RSM_ENABLE
		while(F2612->OPN.ST.framecnt >= F2612->OPN.ST.rateratio)/* Copy-Pasta from Nuked */
		{
			/* Copy-Pasta from Nuked */
			F2612->OPN.ST.prev_sample[0] = F2612->OPN.ST.cur_sample[0];
			F2612->OPN.ST.prev_sample[1] = F2612->OPN.ST.cur_sample[1];
			ym2612_generate_one_native(chip, F2612->OPN.ST.cur_sample);
			F2612->OPN.ST.framecnt -= F2612->OPN.ST.rateratio;
			/* Copy-Pasta from Nuked */
		}
		if (mix)
		{
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		} else {
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		}
		F2612->OPN.ST.framecnt += 1 << RSM_FRAC;
#else
		if (mix)
		{
			ym2612_generate_one_native(chip, bufTmp);
			bufOut[0] += bufTmp[0];
			bufOut[1] += bufTmp[1];
		}
		else
		{
			ym2612_generate_one_native(chip, bufOut);
		}
		bufOut += 2;
#endif
	}
	/* ym2612_post_generate(chip, frames); */
}